

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  TestCaseStats *in_RDI;
  
  ~TestCaseStats(in_RDI);
  operator_delete(in_RDI,0x130);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() = default;